

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# hardwarex.cpp
# Opt level: O1

int StartThreadP33xx(P33X *pP33x)

{
  int iVar1;
  int iVar2;
  long lVar3;
  THREAD_IDENTIFIER *pThreadId;
  CRITICAL_SECTION *__mutex;
  pthread_mutexattr_t attr;
  pthread_mutexattr_t local_2c;
  
  __mutex = P33xCS;
  pThreadId = P33xThreadId;
  lVar3 = 0;
  do {
    if (*(P33X **)((long)addrsP33x + lVar3 * 2) == pP33x) {
      *(undefined4 *)((long)resP33x + lVar3) = 1;
      *(undefined4 *)((long)bExitP33x + lVar3) = 0;
      iVar1 = pthread_mutexattr_init(&local_2c);
      if (iVar1 == 0) {
        iVar1 = pthread_mutexattr_settype(&local_2c,1);
        if (iVar1 == 0) {
          iVar1 = pthread_mutex_init((pthread_mutex_t *)__mutex,&local_2c);
          iVar2 = pthread_mutexattr_destroy(&local_2c);
          if ((iVar1 == 0) && (iVar2 != 0)) {
            pthread_mutex_destroy((pthread_mutex_t *)__mutex);
          }
        }
        else {
          pthread_mutexattr_destroy(&local_2c);
        }
      }
      iVar1 = CreateDefaultThread(P33xThread,pP33x,pThreadId);
      return iVar1;
    }
    lVar3 = lVar3 + 4;
    __mutex = __mutex + 1;
    pThreadId = pThreadId + 1;
  } while (lVar3 != 0x40);
  return 1;
}

Assistant:

HARDWAREX_API int StartThreadP33xx(P33X* pP33x)
{
	int id = 0;

	while (addrsP33x[id] != pP33x)
	{
		id++;
		if (id >= MAX_NB_DEVICES_HARDWAREX) return EXIT_FAILURE;
	}

	resP33x[id] = EXIT_FAILURE;
	bExitP33x[id] = FALSE;
	InitCriticalSection(&P33xCS[id]);
	return CreateDefaultThread(P33xThread, (void*)pP33x, &P33xThreadId[id]);
}